

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneticAlgorithm.hpp
# Opt level: O2

void __thiscall
crsGA::
GeneticAlgorithm<Gen,_crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>,_crsGA::DefaultSelectionPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>,_crsGA::DefaultCrossoverPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>,_crsGA::DefaultReplacementPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>_>
::mutation(GeneticAlgorithm<Gen,_crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>,_crsGA::DefaultSelectionPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>,_crsGA::DefaultCrossoverPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>,_crsGA::DefaultReplacementPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>_>
           *this)

{
  pointer pCVar1;
  pointer pGVar2;
  uint uVar3;
  Gen *gen;
  pointer pGVar4;
  Chromosome<Gen,_ComputeFitness> *c;
  pointer pCVar5;
  result_type_conflict1 rVar6;
  random_device rd;
  mt19937 rng;
  param_type local_2748;
  random_device local_2740;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  std::random_device::random_device(&local_2740);
  uVar3 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&local_13b8,(ulong)uVar3);
  local_2748._M_a = 0.0;
  local_2748._M_b = 1.0;
  pCVar1 = (this->_fittestChromosomes).
           super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pCVar5 = (this->_fittestChromosomes).
                super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pCVar5 != pCVar1; pCVar5 = pCVar5 + 1) {
    pGVar2 = (pCVar5->_genes).super__Vector_base<Gen,_std::allocator<Gen>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pGVar4 = (pCVar5->_genes).super__Vector_base<Gen,_std::allocator<Gen>_>._M_impl.
                  super__Vector_impl_data._M_start; pGVar4 != pGVar2; pGVar4 = pGVar4 + 1) {
      rVar6 = std::uniform_real_distribution<float>::operator()
                        ((uniform_real_distribution<float> *)&local_2748,&local_13b8);
      if (this->_mutationFactor <= rVar6 && rVar6 != this->_mutationFactor) {
        (*(pGVar4->super_IGen)._vptr_IGen[2])
                  (pGVar4,(this->_data).
                          super___shared_ptr<crsGA::UserData,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
    }
  }
  std::random_device::~random_device(&local_2740);
  return;
}

Assistant:

void mutation()
    {
        //Select a random crossover point
        std::random_device rd;                             // used once to initialise (seed) engine
        std::mt19937 rng(rd());                            // random-number engine used (Mersenne-Twister in this case)
        std::uniform_real_distribution<float> uni(0, 1.0); // guaranteed unbiased

        for (auto &c : _fittestChromosomes)
        {
            //Select if mutate this chromosome
            for (auto &gen : c.getGenes())
            {
                if (uni(rng) > _mutationFactor) // random mutation
                {
                    gen.mutate(_data.get());
                }
            }
        }

        //_population.mutate(_mutationFactor, _data.get());
    }